

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void VE4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 auVar4 [16];
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 auVar9 [16];
  
  uVar1 = *(ulong *)(dst + -0x21);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = (int)(uVar1 >> 0x20);
  uVar10 = (undefined1)(uVar1 >> 0x10);
  auVar9[0] = pavgb((char)uVar1,uVar10);
  uVar11 = (undefined1)(uVar1 >> 0x18);
  uVar8 = (undefined1)(uVar1 >> 8);
  auVar9[1] = pavgb(uVar8,uVar11);
  uVar12 = (undefined1)(uVar1 >> 0x20);
  auVar9[2] = pavgb(uVar10,uVar12);
  uVar5 = (undefined1)(uVar1 >> 0x28);
  auVar9[3] = pavgb(uVar11,uVar5);
  uVar6 = (undefined1)(uVar1 >> 0x30);
  auVar9[4] = pavgb(uVar12,uVar6);
  uVar7 = (undefined1)(uVar1 >> 0x38);
  auVar9[5] = pavgb(uVar5,uVar7);
  auVar9[6] = pavgb(uVar6,0);
  auVar9[7] = pavgb(uVar7,0);
  auVar9[8] = pavgb(0,0);
  auVar9[9] = pavgb(0,0);
  auVar9[10] = pavgb(0,0);
  auVar9[0xb] = pavgb(0,0);
  auVar9[0xc] = pavgb(0,0);
  auVar9[0xd] = pavgb(0,0);
  auVar9[0xe] = pavgb(0,0);
  auVar9[0xf] = pavgb(0,0);
  auVar3 = psubusb(auVar9,(auVar4 >> 0x50 ^ auVar3) & _DAT_001481c0);
  uVar8 = pavgb(auVar3[0],uVar8);
  uVar10 = pavgb(auVar3[1],uVar10);
  uVar11 = pavgb(auVar3[2],uVar11);
  uVar12 = pavgb(auVar3[3],uVar12);
  pavgb(auVar3[4],uVar5);
  pavgb(auVar3[5],uVar6);
  pavgb(auVar3[6],uVar7);
  pavgb(auVar3[7],0);
  pavgb(auVar3[8],0);
  pavgb(auVar3[9],0);
  pavgb(auVar3[10],0);
  pavgb(auVar3[0xb],0);
  pavgb(auVar3[0xc],0);
  pavgb(auVar3[0xd],0);
  pavgb(auVar3[0xe],0);
  pavgb(auVar3[0xf],0);
  lVar2 = 0;
  do {
    *(uint *)(dst + lVar2) = CONCAT13(uVar12,CONCAT12(uVar11,CONCAT11(uVar10,uVar8)));
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

static void VE4_SSE2(uint8_t* dst) {    // vertical
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i BCDEFGH0 = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH00 = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i a = _mm_avg_epu8(ABCDEFGH, CDEFGH00);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(ABCDEFGH, CDEFGH00), one);
  const __m128i b = _mm_subs_epu8(a, lsb);
  const __m128i avg = _mm_avg_epu8(b, BCDEFGH0);
  const uint32_t vals = _mm_cvtsi128_si32(avg);
  int i;
  for (i = 0; i < 4; ++i) {
    WebPUint32ToMem(dst + i * BPS, vals);
  }
}